

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

void Wlc_NtkPrintConflict(Wlc_Ntk_t *p,Vec_Int_t *vTrace)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint local_20;
  int i;
  int Entry;
  Vec_Int_t *vTrace_local;
  Wlc_Ntk_t *p_local;
  
  printf("Memory semantics failure trace:\n");
  for (local_20 = 0; iVar1 = Vec_IntSize(vTrace), (int)local_20 < iVar1; local_20 = local_20 + 1) {
    uVar2 = Vec_IntEntry(vTrace,local_20);
    pcVar3 = Wlc_ObjName(p,(int)uVar2 >> 0xb);
    printf("%3d: entry %9d : obj %5d with name %16s in frame %d\n",(ulong)local_20,(ulong)uVar2,
           (ulong)(uint)((int)uVar2 >> 0xb),pcVar3,(ulong)((int)uVar2 >> 1 & 0x3ff));
  }
  return;
}

Assistant:

void Wlc_NtkPrintConflict( Wlc_Ntk_t * p, Vec_Int_t * vTrace )
{
    int Entry, i;
    printf( "Memory semantics failure trace:\n" );
    Vec_IntForEachEntry( vTrace, Entry, i )
        printf( "%3d: entry %9d : obj %5d with name %16s in frame %d\n", i, Entry, Entry >> 11, Wlc_ObjName(p, Entry>>11), (Entry >> 1) & 0x3FF );
}